

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coda-definition-parse.c
# Opt level: O0

int cd_attribute_init(parser_info *info,char **attr)

{
  int iVar1;
  char *pcVar2;
  char *pcVar3;
  coda_type_record_field *pcVar4;
  char *field_name;
  char *real_name;
  char *name;
  char *format;
  char **attr_local;
  parser_info *info_local;
  
  pcVar2 = get_attribute_value(attr,"format");
  if (pcVar2 == (char *)0x0) {
    if (info->node->parent->format_set == 0) {
      __assert_fail("info->node->parent->format_set",
                    "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-definition-parse.c"
                    ,0x5a4,"int cd_attribute_init(parser_info *, const char **)");
    }
    info->node->format = info->node->parent->format;
    info->node->format_set = 1;
    pcVar2 = get_attribute_value(attr,"namexml");
    if (pcVar2 == (char *)0x0) {
      pcVar2 = get_mandatory_attribute_value(attr,"name",info->node->tag);
      if (pcVar2 == (char *)0x0) {
        info_local._4_4_ = -1;
      }
      else {
        field_name = get_attribute_value(attr,"real_name");
        info->node->free_data = coda_type_record_field_delete;
        if ((info->node->format == coda_format_xml) && (field_name == (char *)0x0)) {
          pcVar3 = coda_element_name_from_xml_name(pcVar2);
          pcVar3 = coda_identifier_from_name(pcVar3,(hashtable *)0x0);
          if (pcVar3 == (char *)0x0) {
            return -1;
          }
          pcVar4 = coda_type_record_field_new(pcVar3);
          info->node->data = pcVar4;
          free(pcVar3);
          field_name = pcVar2;
        }
        else {
          pcVar4 = coda_type_record_field_new(pcVar2);
          info->node->data = pcVar4;
        }
        if (info->node->data == (void *)0x0) {
          info_local._4_4_ = -1;
        }
        else if ((field_name == (char *)0x0) ||
                (iVar1 = coda_type_record_field_set_real_name
                                   ((coda_type_record_field *)info->node->data,field_name),
                iVar1 == 0)) {
          register_type_elements(info->node,cd_field_set_type);
          register_sub_element(info->node,element_cd_hidden,dummy_init,cd_field_set_hidden);
          register_sub_element(info->node,element_cd_optional,dummy_init,cd_field_set_optional);
          register_sub_element
                    (info->node,element_cd_available,bool_expression_init,cd_field_set_available);
          register_sub_element
                    (info->node,element_cd_fixed_value,string_data_init,cd_attribute_set_fixed_value
                    );
          info->node->finalise_element = cd_attribute_finalise;
          info_local._4_4_ = 0;
        }
        else {
          info_local._4_4_ = -1;
        }
      }
    }
    else {
      coda_set_error(-400,"attribute \'namexml\' not allowed for Attribute");
      info_local._4_4_ = -1;
    }
  }
  else {
    coda_set_error(-400,"attribute \'format\' not allowed for Attribute");
    info_local._4_4_ = -1;
  }
  return info_local._4_4_;
}

Assistant:

static int cd_attribute_init(parser_info *info, const char **attr)
{
    const char *format = NULL;
    const char *name = NULL;
    const char *real_name = NULL;

    format = get_attribute_value(attr, "format");
    if (format != NULL)
    {
        coda_set_error(CODA_ERROR_DATA_DEFINITION, "attribute 'format' not allowed for Attribute");
        return -1;
    }
    assert(info->node->parent->format_set);
    info->node->format = info->node->parent->format;
    info->node->format_set = 1;
    if (get_attribute_value(attr, "namexml") != NULL)
    {
        coda_set_error(CODA_ERROR_DATA_DEFINITION, "attribute 'namexml' not allowed for Attribute");
        return -1;
    }
    name = get_mandatory_attribute_value(attr, "name", info->node->tag);
    if (name == NULL)
    {
        return -1;
    }
    real_name = get_attribute_value(attr, "real_name");
    info->node->free_data = (free_data_handler)coda_type_record_field_delete;
    if (info->node->format == coda_format_xml && real_name == NULL)
    {
        char *field_name;

        /* still allow the old approach where 'name' could be the xml name of the attribute */
        real_name = name;
        field_name = coda_identifier_from_name(coda_element_name_from_xml_name(name), NULL);
        if (field_name == NULL)
        {
            return -1;
        }
        info->node->data = coda_type_record_field_new(field_name);
        free(field_name);
    }
    else
    {
        info->node->data = coda_type_record_field_new(name);
    }
    if (info->node->data == NULL)
    {
        return -1;
    }
    if (real_name != NULL)
    {
        if (coda_type_record_field_set_real_name((coda_type_record_field *)info->node->data, real_name) != 0)
        {
            return -1;
        }
    }

    register_type_elements(info->node, cd_field_set_type);
    register_sub_element(info->node, element_cd_hidden, dummy_init, cd_field_set_hidden);
    register_sub_element(info->node, element_cd_optional, dummy_init, cd_field_set_optional);
    register_sub_element(info->node, element_cd_available, bool_expression_init, cd_field_set_available);
    register_sub_element(info->node, element_cd_fixed_value, string_data_init, cd_attribute_set_fixed_value);
    info->node->finalise_element = cd_attribute_finalise;

    return 0;
}